

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_solve_ab(REF_INT rows,REF_INT cols,REF_DBL *ab)

{
  double dVar1;
  undefined8 uVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  REF_DBL *pRVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  int iVar15;
  REF_DBL *pRVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  double *pdVar21;
  double dVar22;
  REF_DBL RVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double *local_58;
  
  lVar5 = (long)rows;
  lVar13 = 0;
  uVar11 = 0;
  if (0 < rows) {
    uVar11 = (ulong)(uint)rows;
  }
  lVar10 = lVar5 * 8 + 8;
  lVar20 = 0;
  iVar15 = 1;
  bVar3 = 0;
  pRVar16 = ab;
  uVar17 = 0;
  local_58 = ab;
  do {
    uVar18 = uVar17 & 0xffffffff;
    if ((int)uVar17 < cols) {
      uVar18 = (ulong)(uint)cols;
    }
    if (uVar17 == uVar11) {
      lVar10 = lVar10 * lVar5;
      pRVar16 = (REF_DBL *)((long)ab + lVar10);
      lVar13 = lVar5;
      do {
        if (cols <= lVar13) {
          return (uint)bVar3 << 3;
        }
        lVar20 = lVar5;
        pdVar14 = (double *)((long)ab + lVar10 + -8);
        pRVar6 = pRVar16;
        while (0 < lVar20) {
          lVar4 = lVar20 + -1;
          RVar23 = ab[lVar13 * lVar5 + lVar4];
          pdVar21 = pdVar14;
          for (lVar7 = 0; lVar7 + lVar20 < lVar5; lVar7 = lVar7 + 1) {
            RVar23 = RVar23 - *pdVar21 * pRVar6[lVar7];
            pdVar21 = pdVar21 + lVar5;
          }
          auVar24._0_8_ = ab[(rows + 1) * (int)lVar4] * 1e+20;
          auVar24._8_8_ = RVar23;
          auVar25._8_8_ = -RVar23;
          auVar25._0_8_ = -auVar24._0_8_;
          auVar25 = maxpd(auVar24,auVar25);
          if (auVar25._0_8_ <= auVar25._8_8_) {
            return 4;
          }
          ab[lVar13 * lVar5 + lVar4] = RVar23 / ab[(rows + 1) * (int)lVar4];
          pRVar6 = pRVar6 + -1;
          pdVar14 = (double *)((long)pdVar14 + (lVar5 * 8 ^ 0xfffffffffffffff8U));
          lVar20 = lVar4;
        }
        lVar13 = lVar13 + 1;
        pRVar16 = pRVar16 + lVar5;
      } while( true );
    }
    uVar12 = (ulong)iVar15;
    lVar4 = lVar13 + uVar12 * 8;
    lVar7 = uVar17 * lVar5;
    dVar22 = ab[lVar7 + uVar17];
    RVar23 = -dVar22;
    dVar26 = dVar22;
    if (dVar22 <= RVar23) {
      dVar26 = RVar23;
    }
    uVar19 = uVar17 & 0xffffffff;
    for (uVar8 = uVar12; (long)uVar8 < lVar5; uVar8 = uVar8 + 1) {
      dVar1 = pRVar16[uVar8];
      if (dVar1 <= -dVar1) {
        dVar1 = -dVar1;
      }
      if (dVar26 < dVar1) {
        uVar19 = uVar8 & 0xffffffff;
        dVar26 = dVar1;
      }
    }
    if (uVar17 != uVar19) {
      lVar9 = (long)(int)uVar19 * 8 + lVar13;
      pRVar6 = ab;
      for (uVar19 = uVar18; uVar17 != uVar19; uVar19 = uVar19 - 1) {
        uVar2 = *(undefined8 *)((long)pRVar6 + lVar9);
        *(undefined8 *)((long)pRVar6 + lVar9) = *(undefined8 *)((long)pRVar6 + lVar20);
        *(undefined8 *)((long)pRVar6 + lVar20) = uVar2;
        pRVar6 = pRVar6 + lVar5;
      }
      dVar22 = ab[lVar7 + uVar17];
      RVar23 = -dVar22;
    }
    dVar26 = dVar22 * 1e+20;
    if (dVar26 <= -dVar26) {
      dVar26 = -dVar26;
    }
    pdVar14 = local_58;
    for (uVar19 = uVar18; uVar17 != uVar19; uVar19 = uVar19 - 1) {
      dVar1 = *pdVar14;
      dVar27 = dVar1;
      if (dVar1 <= -dVar1) {
        dVar27 = -dVar1;
      }
      if (dVar26 <= dVar27) {
        return 4;
      }
      if ((double)(~-(ulong)(0.0 < dVar22) & (ulong)RVar23 | -(ulong)(0.0 < dVar22) & (ulong)dVar22)
          < 1e-13) {
        bVar3 = 1;
      }
      *pdVar14 = dVar1 / dVar22;
      pdVar14 = pdVar14 + lVar5;
    }
    for (; (long)uVar12 < lVar5; uVar12 = uVar12 + 1) {
      dVar22 = ab[lVar7 + uVar12];
      pRVar6 = ab;
      for (uVar19 = uVar18; uVar17 != uVar19; uVar19 = uVar19 - 1) {
        *(double *)((long)pRVar6 + lVar4) =
             *(double *)((long)pRVar6 + lVar4) - *(double *)((long)pRVar6 + lVar20) * dVar22;
        pRVar6 = pRVar6 + lVar5;
      }
      lVar4 = lVar4 + 8;
    }
    iVar15 = iVar15 + 1;
    pRVar16 = pRVar16 + lVar5;
    lVar20 = lVar20 + lVar10;
    lVar13 = lVar13 + lVar5 * 8;
    local_58 = local_58 + lVar5 + 1;
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_solve_ab(REF_INT rows, REF_INT cols,
                                       REF_DBL *ab) {
  REF_INT row, col;
  REF_INT i, j, k;
  REF_INT pivot_row;
  REF_DBL largest_pivot, pivot;
  REF_DBL temp;
  REF_DBL factor;
  REF_DBL rhs;
  REF_BOOL ill_condition = REF_FALSE;

  for (col = 0; col < rows; col++) {
    /* find largest pivot */
    pivot_row = col;
    largest_pivot = ABS(ab[pivot_row + rows * col]);
    for (i = col + 1; i < rows; i++) {
      pivot = ABS(ab[i + rows * col]);
      if (pivot > largest_pivot) {
        largest_pivot = pivot;
        pivot_row = i;
      }
    }

    /* exchange rows to get the best pivot on the diagonal,
       unless it is already there */
    if (pivot_row != col)
      for (j = col; j < cols; j++) {
        temp = ab[pivot_row + j * rows];
        ab[pivot_row + j * rows] = ab[col + j * rows];
        ab[col + j * rows] = temp;
      }

    /* normalize pivot row */
    pivot = ab[col + rows * col];
    for (j = col; j < cols; j++) {
      if (!ref_math_divisible(ab[col + j * rows], pivot)) {
        return REF_DIV_ZERO;
      }
      if (ABS(pivot) < 1.0e-13) {
        ill_condition = REF_TRUE;
      }
      ab[col + j * rows] /= pivot;
    }

    /* eliminate sub diagonal terms */
    for (i = col + 1; i < rows; i++) {
      factor = ab[i + col * rows];
      for (j = col; j < cols; j++)
        ab[i + j * rows] -= ab[col + j * rows] * factor;
    }
  }

  for (col = rows; col < cols; col++)
    for (row = rows - 1; row > -1; row--) {
      rhs = ab[row + col * rows];
      for (k = row + 1; k < rows; k++)
        rhs -= ab[row + k * rows] * ab[k + col * rows];
      if (!ref_math_divisible(rhs, ab[row + row * rows])) return REF_DIV_ZERO;
      ab[row + col * rows] = rhs / ab[row + row * rows];
    }

  return (ill_condition ? REF_ILL_CONDITIONED : REF_SUCCESS);
}